

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O2

int test_empty_monster(flatcc_builder_t *B)

{
  MyGame_Example_Monster_ref_t root;
  int iVar1;
  int iVar2;
  void *addr;
  char *pcVar3;
  size_t size;
  
  flatcc_builder_reset(B);
  flatbuffers_buffer_start(B,"MONS");
  MyGame_Example_Monster_start(B);
  MyGame_Example_Monster_name_create_str(B,"MyMonster");
  root = MyGame_Example_Monster_end(B);
  flatcc_builder_end_buffer(B,root);
  addr = flatcc_builder_finalize_aligned_buffer(B,&size);
  hexdump("empty monster table",addr,size,_stderr);
  iVar1 = verify_empty_monster(addr);
  if (iVar1 == 0) {
    iVar1 = MyGame_Example_Monster_verify_as_root_with_identifier(addr,size,"MONS");
    if (iVar1 == 0) {
      iVar2 = MyGame_Example_Monster_verify_as_root(addr,size - 1);
      iVar1 = 0;
      if (iVar2 != 0) goto LAB_00104b69;
      puts("Monster verify failed to detect short buffer");
    }
    else {
      pcVar3 = flatcc_verify_error_string(iVar1);
      printf("could not verify empty monster, got %s\n",pcVar3);
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -1;
LAB_00104b69:
    flatcc_builder_aligned_free(addr);
  }
  return iVar1;
}

Assistant:

int test_empty_monster(flatcc_builder_t *B)
{
    int ret;
    ns(Monster_ref_t) root;
    void *buffer;
    size_t size;

    flatcc_builder_reset(B);

    flatbuffers_buffer_start(B, ns(Monster_file_identifier));
    ns(Monster_start(B));
    /* Cannot make monster empty as name is required. */
    ns(Monster_name_create_str(B, "MyMonster"));
    root = ns(Monster_end(B));
    flatbuffers_buffer_end(B, root);

    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);

    hexdump("empty monster table", buffer, size, stderr);
    if ((ret = verify_empty_monster(buffer))) {
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, ns(Monster_file_identifier))))) {
        printf("could not verify empty monster, got %s\n", flatcc_verify_error_string(ret));
        return -1;
    }

    /*
     * Note: this will assert if the verifier is set to assert during
     * debugging. Also not that a buffer size - 1 is not necessarily
     * invalid, but because we pack vtables tight at the end, we expect
     * failure in this case.
     */
    if (flatcc_verify_ok == ns(Monster_verify_as_root(
                    buffer, size - 1))) {
        printf("Monster verify failed to detect short buffer\n");
        return -1;
    }

done:
    flatcc_builder_aligned_free(buffer);
    return ret;
}